

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChCoordsys<double>::TransformParentToLocal
          (ChCoordsys<double> *this,ChVector<double> *parent)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ChVector<double> *in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  dVar5 = parent->m_data[0] - (this->pos).m_data[0];
  dVar6 = parent->m_data[1] - (this->pos).m_data[1];
  dVar7 = parent->m_data[2] - (this->pos).m_data[2];
  dVar1 = (this->rot).m_data[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1;
  dVar2 = (this->rot).m_data[1];
  dVar1 = dVar1 * dVar1;
  dVar3 = (this->rot).m_data[2];
  dVar4 = (this->rot).m_data[3];
  auVar9._8_8_ = 0x8000000000000000;
  auVar9._0_8_ = 0x8000000000000000;
  auVar9 = vxorpd_avx512vl(auVar17,auVar9);
  dVar16 = auVar9._0_8_;
  auVar15 = ZEXT816(0xbff0000000000000);
  auVar25 = ZEXT816(0x4000000000000000);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar1 + dVar2 * dVar2;
  auVar9 = vfmadd213sd_fma(auVar21,auVar25,auVar15);
  dVar8 = dVar2 * dVar3 - dVar4 * dVar16;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (dVar8 + dVar8) * dVar6;
  auVar9 = vfmadd231sd_fma(auVar26,auVar10,auVar9);
  dVar8 = dVar3 * dVar16 + dVar4 * dVar2;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar7;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar8 + dVar8;
  auVar9 = vfmadd213sd_fma(auVar22,auVar14,auVar9);
  dVar8 = dVar2 * dVar3 + dVar4 * dVar16;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar3 * dVar3 + dVar1;
  auVar17 = vfmadd213sd_fma(auVar23,auVar25,auVar15);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar8 + dVar8;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = auVar17._0_8_ * dVar6;
  auVar17 = vfmadd231sd_fma(auVar24,auVar10,auVar18);
  dVar8 = dVar4 * dVar3 - dVar2 * dVar16;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar8 + dVar8;
  auVar17 = vfmadd213sd_fma(auVar19,auVar14,auVar17);
  dVar8 = dVar4 * dVar2 - dVar3 * dVar16;
  dVar2 = dVar2 * dVar16 + dVar4 * dVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar5;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar6 * (dVar2 + dVar2);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar8 + dVar8;
  auVar11 = vfmadd231sd_fma(auVar13,auVar11,auVar20);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar4 * dVar4 + dVar1;
  auVar10 = vfmadd213sd_fma(auVar12,auVar25,auVar15);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar7;
  auVar10 = vfmadd213sd_fma(auVar10,auVar15,auVar11);
  in_RDI->m_data[0] = auVar9._0_8_;
  in_RDI->m_data[1] = auVar17._0_8_;
  in_RDI->m_data[2] = auVar10._0_8_;
  return in_RDI;
}

Assistant:

ChVector<Real> TransformParentToLocal(const ChVector<Real>& parent) const { return rot.RotateBack(parent - pos); }